

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

Reals __thiscall Omega_h::read_reals_txt(Omega_h *this,istream *stream,LO n,Int ncomps)

{
  double *pdVar1;
  size_t __n;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Reals RVar2;
  Write<double> local_80;
  int local_6c;
  int local_68;
  Int j;
  LO i;
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  HostWrite<double> h_a;
  Int ncomps_local;
  LO n_local;
  istream *stream_local;
  
  __n = (size_t)(uint)ncomps;
  h_a.write_.shared_alloc_.direct_ptr._0_4_ = ncomps;
  h_a.write_.shared_alloc_.direct_ptr._4_4_ = n;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  HostWrite<double>::HostWrite((HostWrite<double> *)local_30,n * ncomps,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  __buf = extraout_RDX;
  for (local_68 = 0; local_68 < h_a.write_.shared_alloc_.direct_ptr._4_4_; local_68 = local_68 + 1)
  {
    for (local_6c = 0; local_6c < (Int)h_a.write_.shared_alloc_.direct_ptr; local_6c = local_6c + 1)
    {
      pdVar1 = HostWrite<double>::operator[]
                         ((HostWrite<double> *)local_30,
                          local_68 * (Int)h_a.write_.shared_alloc_.direct_ptr + local_6c);
      std::istream::operator>>(stream,pdVar1);
      __buf = extraout_RDX_00;
    }
  }
  HostWrite<double>::write((HostWrite<double> *)&local_80,(int)local_30,__buf,__n);
  Read<double>::Read((Read<double> *)this,&local_80);
  Write<double>::~Write(&local_80);
  HostWrite<double>::~HostWrite((HostWrite<double> *)local_30);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX_01;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals read_reals_txt(std::istream& stream, LO n, Int ncomps) {
  auto h_a = HostWrite<Real>(n * ncomps);
  for (LO i = 0; i < n; ++i) {
    for (Int j = 0; j < ncomps; ++j) {
      stream >> h_a[i * ncomps + j];
    }
  }
  return h_a.write();
}